

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mpi_miller_rabin(mbedtls_mpi *X,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi _B;
  mbedtls_mpi W;
  mbedtls_mpi R;
  mbedtls_mpi A;
  mbedtls_mpi RR;
  mbedtls_mpi T;
  mbedtls_mpi_uint local_e8;
  mbedtls_mpi local_e0;
  mbedtls_mpi local_c8;
  long local_b0;
  size_t local_a8;
  mbedtls_mpi local_a0;
  mbedtls_mpi local_88;
  ulong local_70;
  long local_68;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_e0.p = &local_e8;
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_a0.s = 1;
  local_a0.n = 0;
  local_a0.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_88.s = 1;
  local_88.n = 0;
  local_88.p = (ulong *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  local_e8 = 1;
  local_e0.s = 1;
  local_e0.n = 1;
  iVar1 = mbedtls_mpi_sub_mpi(&local_c8,X,&local_e0);
  if (iVar1 == 0) {
    if (local_c8.n == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = 0;
      lVar3 = 0;
      sVar5 = 0;
      do {
        uVar6 = 0;
        do {
          if ((local_c8.p[sVar5] >> (uVar6 & 0x3f) & 1) != 0) {
            sVar2 = uVar6 - lVar3;
            goto LAB_00124ac9;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0x40);
        sVar5 = sVar5 + 1;
        lVar3 = lVar3 + -0x40;
      } while (sVar5 != local_c8.n);
    }
LAB_00124ac9:
    iVar1 = mbedtls_mpi_copy(&local_a0,&local_c8);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&local_a0,sVar2), iVar1 == 0)) {
      local_a8 = sVar2;
      sVar2 = mbedtls_mpi_bitlen(X);
      local_68 = 2;
      if ((sVar2 < 0x514) &&
         ((((local_68 = 3, sVar2 < 0x352 && (local_68 = 4, sVar2 < 0x28a)) &&
           (local_68 = 8, sVar2 < 0x15e)) && (local_68 = 0xc, sVar2 < 0xfa)))) {
        local_68 = (ulong)(sVar2 < 0x96) * 9 + 0x12;
      }
      local_b0 = 0;
LAB_00124cc6:
      iVar1 = mbedtls_mpi_fill_random(&local_88,X->n << 3,f_rng,p_rng);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_c8);
        if (-1 < iVar1) {
          sVar2 = mbedtls_mpi_bitlen(&local_88);
          sVar5 = mbedtls_mpi_bitlen(&local_c8);
          iVar1 = mbedtls_mpi_shift_r(&local_88,(sVar2 - sVar5) + 1);
          if (iVar1 != 0) goto LAB_00124af4;
        }
        *local_88.p = *local_88.p | 3;
        iVar1 = mbedtls_mpi_fill_random(&local_88,X->n << 3,f_rng,p_rng);
        if (iVar1 == 0) {
          iVar4 = 0x20;
          do {
            sVar2 = mbedtls_mpi_bitlen(&local_88);
            sVar5 = mbedtls_mpi_bitlen(&local_c8);
            if ((sVar5 <= sVar2 && sVar2 - sVar5 != 0) &&
               (iVar1 = mbedtls_mpi_shift_r(&local_88,sVar2 - sVar5), iVar1 != 0)) break;
            iVar4 = iVar4 + -1;
            if (iVar4 == 0) {
              return -0xe;
            }
            iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_c8);
            if (iVar1 < 0) {
              local_e8 = 1;
              local_e0.s = 1;
              local_e0.n = 1;
              local_e0.p = &local_e8;
              iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_e0);
              if (0 < iVar1) goto LAB_00124deb;
            }
            iVar1 = mbedtls_mpi_fill_random(&local_88,X->n << 3,f_rng,p_rng);
            if (iVar1 != 0) break;
          } while( true );
        }
      }
    }
  }
LAB_00124af4:
  if (local_c8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_c8.n != 0) {
      sVar2 = 0;
      do {
        local_c8.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_c8.n != sVar2);
    }
    free(local_c8.p);
  }
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  if (local_a0.p != (mbedtls_mpi_uint *)0x0) {
    if (local_a0.n != 0) {
      sVar2 = 0;
      do {
        local_a0.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_a0.n != sVar2);
    }
    free(local_a0.p);
  }
  local_a0.s = 1;
  local_a0.n = 0;
  local_a0.p = (mbedtls_mpi_uint *)0x0;
  if (local_48.p != (mbedtls_mpi_uint *)0x0) {
    if (local_48.n != 0) {
      sVar2 = 0;
      do {
        local_48.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_48.n != sVar2);
    }
    free(local_48.p);
  }
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  if (local_88.p != (ulong *)0x0) {
    if (local_88.n != 0) {
      sVar2 = 0;
      do {
        local_88.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_88.n != sVar2);
    }
    free(local_88.p);
  }
  local_88.s = 1;
  local_88.n = 0;
  local_88.p = (mbedtls_mpi_uint *)0x0;
  if (local_60.p != (mbedtls_mpi_uint *)0x0) {
    if (local_60.n != 0) {
      sVar2 = 0;
      do {
        local_60.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_60.n != sVar2);
    }
    free(local_60.p);
  }
  return iVar1;
LAB_00124deb:
  iVar1 = mbedtls_mpi_exp_mod(&local_88,&local_88,&local_a0,X,&local_60);
  if (iVar1 != 0) goto LAB_00124af4;
  iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_c8);
  if (iVar1 != 0) {
    local_e8 = 1;
    local_e0.s = 1;
    local_e0.n = 1;
    local_e0.p = &local_e8;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_e0);
    if (iVar1 != 0) {
      if (1 < local_a8) {
        uVar6 = 2;
        while (iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_c8), iVar1 != 0) {
          local_70 = uVar6;
          iVar1 = mbedtls_mpi_mul_mpi(&local_48,&local_88,&local_88);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(&local_88,&local_48,X), iVar1 != 0))
          goto LAB_00124af4;
          local_e8 = 1;
          local_e0.s = 1;
          local_e0.n = 1;
          local_e0.p = &local_e8;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_88,&local_e0);
          if ((iVar1 == 0) || (uVar6 = local_70 + 1, local_a8 <= local_70)) break;
        }
      }
      iVar4 = mbedtls_mpi_cmp_mpi(&local_88,&local_c8);
      iVar1 = -0xe;
      if (iVar4 != 0) goto LAB_00124af4;
      local_e8 = 1;
      local_e0.s = 1;
      local_e0.n = 1;
      local_e0.p = &local_e8;
      iVar4 = mbedtls_mpi_cmp_mpi(&local_88,&local_e0);
      if (iVar4 == 0) goto LAB_00124af4;
    }
  }
  local_b0 = local_b0 + 1;
  iVar1 = 0;
  if (local_b0 == local_68) goto LAB_00124af4;
  goto LAB_00124cc6;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, n, s;
    mbedtls_mpi W, R, T, A, RR;

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    i = mbedtls_mpi_bitlen( X );
    /*
     * HAC, table 4.4
     */
    n = ( ( i >= 1300 ) ?  2 : ( i >=  850 ) ?  3 :
          ( i >=  650 ) ?  4 : ( i >=  350 ) ?  8 :
          ( i >=  250 ) ? 12 : ( i >=  150 ) ? 18 : 27 );

    for( i = 0; i < n; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 )
        {
            j = mbedtls_mpi_bitlen( &A ) - mbedtls_mpi_bitlen( &W );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j + 1 ) );
        }
        A.p[0] |= 3;

        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j - k ) );
            }

            if (count++ > 30) {
                return MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}